

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump_kconfig.cpp
# Opt level: O3

void anon_unknown.dwarf_66021::dump_source_class(MetaClass *top,ofstream *file)

{
  pointer psVar1;
  element_type *peVar2;
  pointer psVar3;
  element_type *peVar4;
  char cVar5;
  MetaClass *pMVar6;
  bool bVar7;
  ostream *poVar8;
  shared_ptr<MetaClass> *c;
  pointer psVar9;
  pointer psVar10;
  shared_ptr<MetaProperty> *p;
  shared_ptr<MetaClass> *child;
  shared_ptr<MetaProperty> *p_1;
  vector<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_> *__range1;
  char local_59;
  string local_58;
  MetaClass *local_38;
  
  psVar1 = (top->subclasses).
           super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar9 = (top->subclasses).
                super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar9 != psVar1; psVar9 = psVar9 + 1) {
    dump_source_class((psVar9->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                      file);
  }
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)file,(top->name)._M_dataplus._M_p,(top->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"::",2);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,(top->name)._M_dataplus._M_p,(top->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,"(QObject *parent) : QObject(parent)",0x23);
  psVar9 = (top->subclasses).
           super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (top->subclasses).
           super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = top;
  if (psVar9 != psVar1) {
    do {
      local_58._M_dataplus._M_p._0_1_ = 0x2c;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)file,(char *)&local_58,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      poVar8 = (ostream *)std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t_",2);
      decapitalize(&local_58,
                   &((psVar9->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    name,0);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_58._M_dataplus._M_p,local_58._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(new ",5);
      peVar2 = (psVar9->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(peVar2->name)._M_dataplus._M_p,(peVar2->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"(this))",7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      psVar9 = psVar9 + 1;
    } while (psVar9 != psVar1);
  }
  psVar10 = (local_38->properties).
            super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (local_38->properties).
           super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar10 != psVar3) {
    do {
      if ((((psVar10->super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          default_value)._M_string_length != 0) {
        local_58._M_dataplus._M_p._0_1_ = 0x2c;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)file,(char *)&local_58,1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        poVar8 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\t_",2);
        peVar4 = (psVar10->super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(peVar4->name)._M_dataplus._M_p,(peVar4->name)._M_string_length);
        local_58._M_dataplus._M_p._0_1_ = 0x28;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_58,1);
        peVar4 = (psVar10->super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(peVar4->default_value)._M_dataplus._M_p,
                            (peVar4->default_value)._M_string_length);
        local_58._M_dataplus._M_p._0_1_ = 0x29;
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_58,1);
      }
      psVar10 = psVar10 + 1;
    } while (psVar10 != psVar3);
  }
  cVar5 = (char)file;
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  local_58._M_dataplus._M_p._0_1_ = 0x7b;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,(char *)&local_58,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  pMVar6 = local_38;
  if ((local_38->parent).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"\tload();\n",9);
  }
  local_58._M_dataplus._M_p._0_1_ = 0x7d;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,(char *)&local_58,1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  dump_source_get_methods(file,pMVar6);
  psVar9 = (pMVar6->subclasses).
           super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (pMVar6->subclasses).
           super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar9 != psVar1) {
    do {
      peVar2 = (psVar9->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)file,(peVar2->name)._M_dataplus._M_p,
                          (peVar2->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"* ",2);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(local_38->name)._M_dataplus._M_p,(local_38->name)._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"::",2);
      decapitalize(&local_58,
                   &((psVar9->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    name,0);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_58._M_dataplus._M_p,local_58._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"() const",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      local_58._M_dataplus._M_p._0_1_ = 0x7b;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)file,(char *)&local_58,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"\treturn _",9);
      decapitalize(&local_58,
                   &((psVar9->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    name,0);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)file,local_58._M_dataplus._M_p,local_58._M_string_length);
      local_59 = ';';
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_59,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      local_58._M_dataplus._M_p._0_1_ = 0x7d;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)file,(char *)&local_58,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      psVar9 = psVar9 + 1;
    } while (psVar9 != psVar1);
  }
  pMVar6 = local_38;
  dump_source_set_methods(file,local_38,true);
  psVar10 = (pMVar6->properties).
            super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (pMVar6->properties).
           super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar10 != psVar3) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"void ",5);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)file,(local_38->name)._M_dataplus._M_p,
                          (local_38->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"::set",5);
      capitalize(&local_58,
                 &((psVar10->super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  name,0);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,local_58._M_dataplus._M_p,local_58._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Rule(std::function<bool(",0x18);
      peVar4 = (psVar10->super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(peVar4->type)._M_dataplus._M_p,(peVar4->type)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,")> rule)",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      local_58._M_dataplus._M_p._0_1_ = 0x7b;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)file,(char *)&local_58,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      local_58._M_dataplus._M_p._0_1_ = 9;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)file,(char *)&local_58,1);
      peVar4 = (psVar10->super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,(peVar4->name)._M_dataplus._M_p,(peVar4->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Rule = rule;",0xc);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      local_58._M_dataplus._M_p._0_1_ = 0x7d;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)file,(char *)&local_58,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      psVar10 = psVar10 + 1;
    } while (psVar10 != psVar3);
    psVar10 = (local_38->properties).
              super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (local_38->properties).
             super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar10 != psVar3) {
      do {
        peVar4 = (psVar10->super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if ((peVar4->default_value)._M_string_length != 0) {
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)file,(peVar4->type)._M_dataplus._M_p,
                              (peVar4->type)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(local_38->name)._M_dataplus._M_p,
                              (local_38->name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"::",2);
          peVar4 = (psVar10->super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(peVar4->name)._M_dataplus._M_p,(peVar4->name)._M_string_length
                             );
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"Default() const",0xf);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          local_58._M_dataplus._M_p._0_1_ = 0x7b;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)file,(char *)&local_58,1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          local_58._M_dataplus._M_p._0_1_ = 9;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)file,(char *)&local_58,1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"return ",7);
          peVar4 = (psVar10->super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar8,(peVar4->default_value)._M_dataplus._M_p,
                              (peVar4->default_value)._M_string_length);
          local_58._M_dataplus._M_p._0_1_ = 0x3b;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_58,1);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          local_58._M_dataplus._M_p._0_1_ = 0x7d;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,(char *)&local_58,1);
          std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar5);
          std::ostream::put(cVar5);
          std::ostream::flush();
        }
        psVar10 = psVar10 + 1;
      } while (psVar10 != psVar3);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"void ",5);
  pMVar6 = local_38;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)file,(local_38->name)._M_dataplus._M_p,
                      (local_38->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"::loadDefaults()",0x10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
  std::ostream::put((char)poVar8);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"{",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  psVar9 = (pMVar6->subclasses).
           super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (pMVar6->subclasses).
           super__Vector_base<std::shared_ptr<MetaClass>,_std::allocator<std::shared_ptr<MetaClass>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar9 != psVar1) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"\t_",2);
      decapitalize(&local_58,
                   &((psVar9->super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                    name,0);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)file,local_58._M_dataplus._M_p,local_58._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"->loadDefaults();",0x11);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      psVar9 = psVar9 + 1;
    } while (psVar9 != psVar1);
  }
  psVar10 = (local_38->properties).
            super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (local_38->properties).
           super__Vector_base<std::shared_ptr<MetaProperty>,_std::allocator<std::shared_ptr<MetaProperty>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar10 != psVar3) {
    do {
      if ((((psVar10->super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          default_value)._M_string_length != 0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"\tset",4);
        capitalize(&local_58,
                   &((psVar10->super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                    ->name,0);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)file,local_58._M_dataplus._M_p,local_58._M_string_length);
        local_59 = '(';
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,&local_59,1);
        peVar4 = (psVar10->super___shared_ptr<MetaProperty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar8,(peVar4->default_value)._M_dataplus._M_p,
                            (peVar4->default_value)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,");",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      psVar10 = psVar10 + 1;
    } while (psVar10 != psVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"}",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar5);
  std::ostream::put(cVar5);
  std::ostream::flush();
  pMVar6 = local_38;
  if ((local_38->parent).super___shared_ptr<MetaClass,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"void ",5);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)file,(pMVar6->name)._M_dataplus._M_p,
                        (pMVar6->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"::sync()",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    local_58._M_dataplus._M_p._0_1_ = 0x7b;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,(char *)&local_58,1)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    bVar7 = class_or_subclass_have_properties(pMVar6);
    if (bVar7) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)file,"\tKSharedConfigPtr internal_config = KSharedConfig::openConfig();"
                 ,0x40);
      std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"internal_config","");
      dump_source_class_settings_set_values(pMVar6,file,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    local_58._M_dataplus._M_p._0_1_ = 0x7d;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,(char *)&local_58,1)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar5);
    std::ostream::put(cVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"void ",5);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)file,(pMVar6->name)._M_dataplus._M_p,
                        (pMVar6->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"::load()",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    local_58._M_dataplus._M_p._0_1_ = 0x7b;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,(char *)&local_58,1)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    bVar7 = class_or_subclass_have_properties(pMVar6);
    if (bVar7) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)file,"\tKSharedConfigPtr internal_config = KSharedConfig::openConfig();"
                 ,0x40);
      std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar5);
      std::ostream::put(cVar5);
      std::ostream::flush();
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"internal_config","");
      dump_source_class_settings_get_values(pMVar6,file,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    local_58._M_dataplus._M_p._0_1_ = 0x7d;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,(char *)&local_58,1)
    ;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar5);
    std::ostream::put(cVar5);
    std::ostream::flush();
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)file,(pMVar6->name)._M_dataplus._M_p,
                        (pMVar6->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"* ",2);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(pMVar6->name)._M_dataplus._M_p,(pMVar6->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"::self()",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"{",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar5);
    std::ostream::put(cVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"\tstatic ",8);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)file,(pMVar6->name)._M_dataplus._M_p,
                        (pMVar6->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," s;",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"\treturn &s;",0xb);
    std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar5);
    std::ostream::put(cVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)file,"}",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + cVar5);
    std::ostream::put(cVar5);
    std::ostream::flush();
  }
  return;
}

Assistant:

void dump_source_class(MetaClass *top, std::ofstream &file) {
  for (auto &&child : top->subclasses) {
    dump_source_class(child.get(), file);
  }

  // Constructors.
  file << top->name << "::" << top->name
       << "(QObject *parent) : QObject(parent)";
  for (auto &&c : top->subclasses) {
    file << ',' << std::endl
         << "\t_" << decapitalize(c->name, 0) << "(new " << c->name
         << "(this))";
  }
  for (auto &&p : top->properties) {
    if (p->default_value.size()) {
      file << ',' << std::endl
           << "\t_" << p->name << '(' << p->default_value << ')';
    }
  }
  file << std::endl;
  file << '{' << std::endl;
  if (!top->parent) {
    file << "\tload();\n";
  }
  file << '}' << std::endl;
  file << std::endl;

  // get - methods.
  dump_source_get_methods(file, top);
  for (auto &&c : top->subclasses) {
    file << c->name << "* " << top->name << "::" << decapitalize(c->name)
         << "() const" << std::endl;
    file << '{' << std::endl;
    file << "\treturn _" << decapitalize(c->name) << ';' << std::endl;
    file << '}' << std::endl;
    file << std::endl;
  }

  // set-methods
  dump_source_set_methods(file, top);

  // rule-methods {
  for (auto &&p : top->properties) {
    file << "void " << top->name << "::set" << capitalize(p->name, 0)
         << "Rule(std::function<bool(" << p->type << ")> rule)" << std::endl;
    file << '{' << std::endl;
    file << '\t' << p->name << "Rule = rule;" << std::endl;
    file << '}' << std::endl;
    file << std::endl;
  }

  // default values
  for (auto &&p : top->properties) {
      if (p->default_value.size()) {
          file << p->type << " " << top->name << "::" << p->name << "Default() const" << std::endl;
          file << '{' << std::endl;
          file << '\t' << "return " << p->default_value << ';' << std::endl;
          file << '}';
          file << std::endl;
    }
  }

  // load defaults
  file << "void " << top->name << "::loadDefaults()" << std::endl;
  file << "{" << std::endl;
  for (auto &&c : top->subclasses) {
    file << "\t_" << decapitalize(c->name, 0) << "->loadDefaults();" << std::endl;
  }

  for (auto &&p : top->properties) {
    if (p->default_value.size()) {
        file << "\tset" << capitalize(p->name, 0) << '(' << p->default_value << ");" << std::endl;
    }
  }
  file << "}" << std::endl;

  // main preferences class
  if (!top->parent) {
      // The Sync method.
    file << "void " << top->name << "::sync()" << std::endl;
    file << '{' << std::endl;
    if (class_or_subclass_have_properties(top)) {
      file << "\tKSharedConfigPtr internal_config = KSharedConfig::openConfig();" << std::endl;
      dump_source_class_settings_set_values(top, file, "internal_config");
    }
    file << '}' << std::endl;
    file << std::endl;

    // The "load" method.
    file << "void " << top->name << "::load()" << std::endl;
    file << '{' << std::endl;
    if (class_or_subclass_have_properties(top)) {
      file << "\tKSharedConfigPtr internal_config = KSharedConfig::openConfig();" << std::endl;
      dump_source_class_settings_get_values(top, file, "internal_config");
    }
    file << '}' << std::endl;
    file << std::endl;
    file << top->name << "* " << top->name << "::self()" << std::endl;
    file << "{" << std::endl;
    file << "\tstatic " << top->name << " s;" << std::endl;
    file << "\treturn &s;" << std::endl;
    file << "}" << std::endl;
  }
}